

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void LowerCase(string *TextValue)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = (TextValue->_M_dataplus)._M_p;
  for (pcVar3 = pcVar2; pcVar3 < pcVar2 + TextValue->_M_string_length; pcVar3 = pcVar3 + 1) {
    iVar1 = tolower((int)*pcVar3);
    *pcVar3 = (char)iVar1;
    pcVar2 = (TextValue->_M_dataplus)._M_p;
  }
  return;
}

Assistant:

void LowerCase(
	std::string& TextValue		/**< string to be converted (in place) to lower case */
)
{
	//
	// Force string to lower case so it's easier to handle
	//
	for (std::string::iterator uploop = TextValue.begin();
		uploop < TextValue.end(); uploop++)
	{
		*uploop = tolower(*uploop);
	}
}